

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O0

int __thiscall
crnlib::texture_conversion::convert_stats::init(convert_stats *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uchar *p;
  ulong extraout_RAX;
  ulong uVar6;
  mipmapped_texture *in_RCX;
  char *in_RDX;
  format in_R8D;
  byte in_R9B;
  uint height_1;
  uint width_1;
  uint i_1;
  lzma_codec lossless_codec;
  vector<unsigned_char> cmp_tex_bytes;
  undefined1 local_58 [8];
  vector<unsigned_char> dst_tex_bytes;
  uint height;
  uint width;
  uint i;
  bool lzma_stats_local;
  format dst_file_type_local;
  mipmapped_texture *src_tex_local;
  char *pDst_filename_local;
  char *pSrc_filename_local;
  convert_stats *this_local;
  
  dynamic_string::operator=(&this->m_src_filename,(char *)ctx);
  dynamic_string::operator=(&this->m_dst_filename,in_RDX);
  this->m_dst_file_type = in_R8D;
  this->m_pInput_tex = in_RCX;
  file_utils::get_file_size((char *)ctx,&this->m_input_file_size);
  file_utils::get_file_size(in_RDX,&this->m_output_file_size);
  this->m_total_input_pixels = 0;
  for (height = 0; uVar2 = mipmapped_texture::get_num_levels(in_RCX), height < uVar2;
      height = height + 1) {
    uVar2 = mipmapped_texture::get_width(in_RCX);
    uVar3 = math::maximum<unsigned_int>(1,uVar2 >> ((byte)height & 0x1f));
    uVar2 = mipmapped_texture::get_height(in_RCX);
    dst_tex_bytes.m_capacity = math::maximum<unsigned_int>(1,uVar2 >> ((byte)height & 0x1f));
    iVar4 = uVar3 * dst_tex_bytes.m_capacity;
    uVar2 = mipmapped_texture::get_num_faces(in_RCX);
    this->m_total_input_pixels = iVar4 * uVar2 + this->m_total_input_pixels;
  }
  this->m_output_comp_file_size = 0;
  this->m_total_output_pixels = 0;
  if ((in_R9B & 1) != 0) {
    vector<unsigned_char>::vector((vector<unsigned_char> *)local_58);
    bVar1 = cfile_stream::read_file_into_array(in_RDX,(vector<unsigned_char> *)local_58);
    if (bVar1) {
      uVar2 = vector<unsigned_char>::size((vector<unsigned_char> *)local_58);
      if (uVar2 == 0) {
        console::error("Output file is empty: %s",in_RDX);
        this_local._7_1_ = 0;
        bVar1 = true;
      }
      else {
        vector<unsigned_char>::vector((vector<unsigned_char> *)&lossless_codec.m_pUncompress);
        lzma_codec::lzma_codec((lzma_codec *)&width_1);
        p = vector<unsigned_char>::get_ptr((vector<unsigned_char> *)local_58);
        uVar2 = vector<unsigned_char>::size((vector<unsigned_char> *)local_58);
        bVar1 = lzma_codec::pack((lzma_codec *)&width_1,p,uVar2,
                                 (vector<unsigned_char> *)&lossless_codec.m_pUncompress);
        if (bVar1) {
          uVar2 = vector<unsigned_char>::size
                            ((vector<unsigned_char> *)&lossless_codec.m_pUncompress);
          this->m_output_comp_file_size = (ulong)uVar2;
        }
        lzma_codec::~lzma_codec((lzma_codec *)&width_1);
        vector<unsigned_char>::~vector((vector<unsigned_char> *)&lossless_codec.m_pUncompress);
        bVar1 = false;
      }
    }
    else {
      console::error("Failed loading output file: %s",in_RDX);
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    vector<unsigned_char>::~vector((vector<unsigned_char> *)local_58);
    uVar6 = 0;
    if (bVar1) goto LAB_00177da3;
  }
  bVar1 = mipmapped_texture::read_from_file(&this->m_output_tex,in_RDX,this->m_dst_file_type);
  if (bVar1) {
    height_1 = 0;
    while( true ) {
      uVar2 = mipmapped_texture::get_num_levels(&this->m_output_tex);
      uVar6 = (ulong)height_1;
      if (uVar2 <= height_1) break;
      uVar2 = mipmapped_texture::get_width(&this->m_output_tex);
      uVar3 = math::maximum<unsigned_int>(1,uVar2 >> ((byte)height_1 & 0x1f));
      uVar2 = mipmapped_texture::get_height(&this->m_output_tex);
      uVar5 = math::maximum<unsigned_int>(1,uVar2 >> ((byte)height_1 & 0x1f));
      uVar2 = mipmapped_texture::get_num_faces(&this->m_output_tex);
      this->m_total_output_pixels = uVar3 * uVar5 * uVar2 + this->m_total_output_pixels;
      height_1 = height_1 + 1;
    }
    this_local._7_1_ = 1;
  }
  else {
    console::error("Failed loading output file: %s",in_RDX);
    this_local._7_1_ = 0;
    uVar6 = extraout_RAX;
  }
LAB_00177da3:
  return (uint)CONCAT71((int7)(uVar6 >> 8),this_local._7_1_) & 0xffffff01;
}

Assistant:

bool convert_stats::init(const char* pSrc_filename, const char* pDst_filename, mipmapped_texture& src_tex,
            texture_file_types::format dst_file_type, bool lzma_stats)
        {
            m_src_filename = pSrc_filename;
            m_dst_filename = pDst_filename;
            m_dst_file_type = dst_file_type;

            m_pInput_tex = &src_tex;

            file_utils::get_file_size(pSrc_filename, m_input_file_size);
            file_utils::get_file_size(pDst_filename, m_output_file_size);

            m_total_input_pixels = 0;
            for (uint i = 0; i < src_tex.get_num_levels(); i++)
            {
                uint width = math::maximum<uint>(1, src_tex.get_width() >> i);
                uint height = math::maximum<uint>(1, src_tex.get_height() >> i);
                m_total_input_pixels += width * height * src_tex.get_num_faces();
            }

            m_output_comp_file_size = 0;

            m_total_output_pixels = 0;

            if (lzma_stats)
            {
                vector<uint8> dst_tex_bytes;
                if (!cfile_stream::read_file_into_array(pDst_filename, dst_tex_bytes))
                {
                    console::error("Failed loading output file: %s", pDst_filename);
                    return false;
                }
                if (!dst_tex_bytes.size())
                {
                    console::error("Output file is empty: %s", pDst_filename);
                    return false;
                }
                vector<uint8> cmp_tex_bytes;
                lzma_codec lossless_codec;
                if (lossless_codec.pack(dst_tex_bytes.get_ptr(), dst_tex_bytes.size(), cmp_tex_bytes))
                {
                    m_output_comp_file_size = cmp_tex_bytes.size();
                }
            }

            if (!m_output_tex.read_from_file(pDst_filename, m_dst_file_type))
            {
                console::error("Failed loading output file: %s", pDst_filename);
                return false;
            }

            for (uint i = 0; i < m_output_tex.get_num_levels(); i++)
            {
                uint width = math::maximum<uint>(1, m_output_tex.get_width() >> i);
                uint height = math::maximum<uint>(1, m_output_tex.get_height() >> i);
                m_total_output_pixels += width * height * m_output_tex.get_num_faces();
            }
            CRNLIB_ASSERT(m_total_output_pixels == m_output_tex.get_total_pixels_in_all_faces_and_mips());

            return true;
        }